

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate-solution.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  Solution solution;
  Parameters parameters;
  Problem problem;
  ProblemGraph problemGraph;
  
  parseCommandLine(&parameters,argc,argv);
  lineage::loadProblem(&problem,&parameters.nodesFileName,&parameters.edgesFileName);
  lineage::loadSolution(&solution,&parameters.fragmentEdgeLabelsFileName);
  lineage::ProblemGraph::ProblemGraph(&problemGraph,&problem);
  lineage::validate(&problemGraph,&solution);
  lineage::ProblemGraph::~ProblemGraph(&problemGraph);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&solution);
  lineage::Problem::~Problem(&problem);
  Parameters::~Parameters(&parameters);
  return 0;
}

Assistant:

int main(int argc, char** argv)
try
{
    auto parameters = parseCommandLine(argc, argv);
    auto problem = lineage::loadProblem(parameters.nodesFileName, parameters.edgesFileName);
    auto solution = lineage::loadSolution(parameters.fragmentEdgeLabelsFileName);

    lineage::ProblemGraph problemGraph(problem);
    lineage::validate(problemGraph, solution);

    return 0;
}
catch (const runtime_error& error)
{
    cerr << "error: " << error.what() << endl;
    return 1;
}